

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> * __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
GetUnusedHeapBlock(HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                   *this)

{
  code *pcVar1;
  bool bVar2;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar3;
  undefined8 *in_FS_OFFSET;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *local_18;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this_local;
  
  local_18 = this->emptyBlockList;
  if (local_18 == (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    local_18 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::New(this);
    if ((this->super_HeapBucket).emptyHeapBlockCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x2fd,"(this->emptyHeapBlockCount == 0)","this->emptyHeapBlockCount == 0")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  else {
    pSVar3 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(local_18);
    this->emptyBlockList = pSVar3;
    (this->super_HeapBucket).emptyHeapBlockCount = (this->super_HeapBucket).emptyHeapBlockCount - 1;
  }
  return local_18;
}

Assistant:

TBlockType*
HeapBucketT<TBlockType>::GetUnusedHeapBlock()
{
    // Add a new heap block
    TBlockType * heapBlock = emptyBlockList;
    if (heapBlock == nullptr)
    {
        // We couldn't find a reusable heap block
        heapBlock = TBlockType::New(this);
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        Assert(this->emptyHeapBlockCount == 0);
#endif
    }
    else
    {
        emptyBlockList = heapBlock->GetNextBlock();
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        this->emptyHeapBlockCount--;
#endif
    }
    return heapBlock;
}